

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::DebugInfoRenderer::DebugInfoRenderer
          (DebugInfoRenderer *this,RenderContext *ctx)

{
  RenderContext *renderCtx;
  ShaderProgram *this_00;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  ProgramSources local_f8;
  RenderContext *local_18;
  RenderContext *ctx_local;
  DebugInfoRenderer *this_local;
  
  this->m_ctx = ctx;
  this->m_prog = (ShaderProgram *)0x0;
  local_18 = ctx;
  ctx_local = (RenderContext *)this;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_posBuf);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_ndxBuf);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "attribute highp vec2 a_pos;\nvoid main (void)\n{\n\tgl_Position = vec4(a_pos, -1.0, 1.0);\n}\n"
             ,&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,
             "void main(void)\n{\n\tgl_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n",&local_141);
  glu::makeVtxFragSources(&local_f8,&local_118,&local_140);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_f8);
  this->m_prog = this_00;
  glu::ProgramSources::~ProgramSources(&local_f8);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  return;
}

Assistant:

DebugInfoRenderer::DebugInfoRenderer (const glu::RenderContext& ctx)
	: m_ctx			(ctx)
	, m_prog		(DE_NULL)
{
	DE_ASSERT(!m_prog);
	m_prog = new glu::ShaderProgram(ctx, glu::makeVtxFragSources(
		"attribute highp vec2 a_pos;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = vec4(a_pos, -1.0, 1.0);\n"
		"}\n",

		"void main(void)\n"
		"{\n"
		"	gl_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
		"}\n"));
}